

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O0

void ncnn::im2col_sgemm_pack1to4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _val;
  __m128 _w0_2;
  int j_2;
  __m128 _sum;
  int nn_2;
  float *kptr0_2;
  float *tmpptr_5;
  __m128 _val3_1;
  __m128 _val2_1;
  __m128 _val1_1;
  __m128 _val0_1;
  __m128 _w0_1;
  int j_1;
  __m128 _sum3_1;
  __m128 _sum2_1;
  __m128 _sum1_1;
  __m128 _sum0_1;
  int nn_1;
  float *kptr0_1;
  float *tmpptr_4;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  __m128 _w0;
  int j;
  __m128 _sum7;
  __m128 _sum6;
  __m128 _sum5;
  __m128 _sum4;
  __m128 _sum3;
  __m128 _sum2;
  __m128 _sum1;
  __m128 _sum0;
  int nn;
  float *kptr0;
  float *tmpptr_3;
  int i_3;
  float *biasptr;
  float zeros [4];
  float *outptr0;
  int p;
  int k_2;
  float *img0_2;
  int q_2;
  float *tmpptr_2;
  int i_2;
  __m128 _r0_1;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  int ii_1;
  __m128 _r1;
  __m128 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_11;
  Mat *m_9;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_12;
  Mat *m_10;
  Mat *m_8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  undefined8 in_stack_ffffffffffffe120;
  undefined4 in_stack_ffffffffffffe128;
  undefined4 in_stack_ffffffffffffe12c;
  int in_stack_ffffffffffffe134;
  int in_stack_ffffffffffffe138;
  int in_stack_ffffffffffffe13c;
  Mat *in_stack_ffffffffffffe140;
  undefined4 in_stack_ffffffffffffe1a0;
  undefined4 in_stack_ffffffffffffe1a4;
  undefined8 *local_1cf0;
  int local_1b6c;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b48;
  undefined8 local_1b40;
  undefined8 local_1b38;
  undefined4 local_1b30;
  long local_1b28;
  undefined4 local_1b20;
  undefined4 local_1b1c;
  undefined4 local_1b18;
  undefined4 local_1b14;
  undefined4 local_1b10;
  undefined8 local_1b08;
  undefined8 *local_1b00;
  undefined8 local_1af8;
  undefined8 local_1af0;
  undefined8 local_1ae8;
  undefined4 local_1ae0;
  long *local_1ad8;
  undefined4 local_1ad0;
  undefined4 local_1acc;
  undefined4 local_1ac8;
  undefined4 local_1ac4;
  undefined4 local_1ac0;
  undefined8 local_1ab8;
  float *local_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  int local_1a4c;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  int local_19fc;
  undefined8 local_19f8;
  undefined8 local_19f0;
  undefined8 local_19e8;
  undefined4 local_19e0;
  long local_19d8;
  undefined4 local_19d0;
  undefined4 local_19cc;
  undefined4 local_19c8;
  undefined4 local_19c4;
  undefined4 local_19c0;
  undefined8 local_19b8;
  undefined8 *local_19b0;
  undefined8 local_19a8;
  undefined8 local_19a0;
  undefined8 local_1998;
  undefined4 local_1990;
  long *local_1988;
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined8 local_1968;
  float *local_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  int local_18bc;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  int local_182c;
  undefined8 local_1828;
  undefined8 local_1820;
  undefined8 local_1818;
  undefined4 local_1810;
  long local_1808;
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined8 local_17e8;
  undefined8 *local_17e0;
  undefined8 local_17d8;
  undefined8 local_17d0;
  undefined8 local_17c8;
  undefined4 local_17c0;
  long *local_17b8;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined4 local_17a0;
  undefined8 local_1798;
  float *local_1790;
  int local_1784;
  undefined8 *local_1780;
  undefined8 local_1778 [3];
  undefined8 local_1760;
  undefined8 local_1758;
  undefined8 local_1750;
  undefined4 local_1748;
  long local_1740;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined8 local_1720;
  undefined1 (*local_1718) [16];
  int local_1710;
  int local_170c;
  undefined8 local_1708;
  undefined8 local_1700;
  undefined8 local_16f8;
  undefined4 local_16f0;
  long local_16e8;
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined8 local_16c8;
  undefined4 *local_16c0;
  int local_16b4;
  undefined8 local_16b0;
  undefined8 local_16a8;
  undefined8 local_16a0;
  undefined4 local_1698;
  long *local_1690;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined8 local_1670;
  undefined4 *local_1668;
  int local_165c;
  undefined8 local_1658;
  undefined8 uStack_1650;
  int local_163c;
  undefined8 local_1638;
  undefined8 local_1630;
  undefined8 local_1628;
  undefined4 local_1620;
  long local_1618;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined4 local_1600;
  undefined8 local_15f8;
  undefined1 (*local_15f0) [16];
  int local_15e4;
  undefined8 local_15e0;
  undefined8 local_15d8;
  undefined8 local_15d0;
  undefined4 local_15c8;
  long *local_15c0;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  undefined4 local_15a8;
  undefined8 local_15a0;
  undefined1 (*local_1598) [16];
  int local_1590;
  int local_158c;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  int local_155c;
  undefined8 local_1558;
  undefined8 local_1550;
  undefined8 local_1548;
  undefined4 local_1540;
  long local_1538;
  undefined4 local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  undefined4 local_1524;
  undefined4 local_1520;
  undefined8 local_1518;
  undefined8 *local_1510;
  int local_1504;
  undefined8 local_1500;
  undefined8 local_14f8;
  undefined8 local_14f0;
  undefined4 local_14e8;
  long *local_14e0;
  undefined4 local_14d8;
  undefined4 local_14d4;
  undefined4 local_14d0;
  undefined4 local_14cc;
  undefined4 local_14c8;
  undefined8 local_14c0;
  undefined8 *local_14b8;
  int local_14ac;
  int local_14a8;
  int local_14a4;
  int local_14a0;
  void *local_1490;
  int *local_1488;
  long local_1480;
  undefined4 local_1478;
  long *local_1470;
  undefined4 local_1468;
  int local_1464;
  int local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  long local_1450;
  long local_1448;
  int local_1440;
  int local_143c;
  int local_1438;
  int local_1434;
  long *local_1420;
  long *local_1418;
  long *local_1410;
  void **local_1408;
  undefined8 *local_1400;
  undefined8 *local_13f0;
  undefined8 *local_13e0;
  undefined8 *local_13d0;
  undefined8 *local_13c0;
  undefined8 *local_13b0;
  undefined8 *local_13a0;
  undefined8 *local_1390;
  undefined8 *local_1380;
  undefined8 *local_1370;
  undefined8 *local_1360;
  undefined8 *local_1350;
  undefined8 *local_1340;
  void **local_1330;
  int local_1310;
  undefined4 local_130c;
  void **local_1308;
  undefined8 *local_12e8;
  undefined8 *local_12c8;
  undefined8 *local_12a8;
  undefined8 *local_1288;
  undefined8 *local_1268;
  undefined8 *local_1248;
  undefined8 *local_1228;
  undefined8 *local_1208;
  undefined8 *local_11e8;
  undefined8 *local_11c8;
  undefined8 *local_11a8;
  undefined8 *local_1188;
  undefined8 *local_1168;
  undefined1 local_115d;
  int local_115c;
  void **local_1158;
  undefined8 *local_1150;
  undefined1 local_112d;
  int local_112c;
  void **local_1128;
  undefined8 *local_1120;
  undefined1 local_10fd;
  int local_10fc;
  void **local_10f8;
  undefined8 *local_10f0;
  undefined1 local_10cd;
  int local_10cc;
  undefined8 *local_10c0;
  undefined1 local_109d;
  int local_109c;
  void **local_1098;
  undefined8 *local_1090;
  undefined1 local_106d;
  int local_106c;
  void **local_1068;
  undefined8 *local_1060;
  undefined1 local_103d;
  int local_103c;
  void **local_1038;
  undefined8 *local_1030;
  undefined8 *local_1010;
  undefined8 *local_1008;
  undefined8 *local_1000;
  undefined8 *local_ff8;
  undefined8 *local_ff0;
  undefined8 *local_fe8;
  undefined8 *local_fe0;
  undefined8 *local_fd8;
  undefined8 *local_fd0;
  undefined8 *local_fc8;
  undefined1 local_fb5;
  int local_fb4;
  undefined8 *local_fa8;
  undefined1 local_f85;
  int local_f84;
  undefined8 *local_f78;
  undefined1 local_f55;
  int local_f54;
  undefined8 *local_f48;
  undefined1 local_f25;
  int local_f24;
  undefined8 *local_f18;
  undefined1 local_ef5;
  int local_ef4;
  undefined8 *local_ee8;
  undefined1 local_ec5;
  int local_ec4;
  undefined8 *local_eb8;
  undefined8 *local_e98;
  undefined8 *local_e90;
  undefined8 *local_e88;
  void *local_d48;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined1 (*local_d20) [16];
  undefined1 (*local_d18) [16];
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined1 (*local_cf0) [16];
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined1 (*local_cd0) [16];
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined1 (*local_cb0) [16];
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined1 (*local_c90) [16];
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined1 (*local_c70) [16];
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined1 (*local_c50) [16];
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined1 (*local_c30) [16];
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined1 (*local_c10) [16];
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined1 (*local_bf0) [16];
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined1 (*local_bd0) [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined1 (*local_bb0) [16];
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined1 (*local_b90) [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined1 (*local_b70) [16];
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined1 (*local_b50) [16];
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined1 (*local_b30) [16];
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae4;
  float *local_ae0;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ac4;
  float *local_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa4;
  float *local_aa0;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a84;
  float *local_a80;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a64;
  float *local_a60;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a44;
  float *local_a40;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a24;
  float *local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a04;
  float *local_a00;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e4;
  float *local_9e0;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c4;
  float *local_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a4;
  float *local_9a0;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_984;
  float *local_980;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_964;
  float *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined1 local_918 [16];
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined1 local_788 [16];
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  long local_3a8;
  undefined4 local_39c;
  long local_398;
  long local_390;
  undefined4 local_384;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  long local_370;
  undefined4 local_364;
  long local_360;
  long local_358;
  undefined4 local_34c;
  int local_348;
  int local_344;
  undefined8 *local_340;
  long local_338;
  undefined4 local_32c;
  long local_328;
  long local_320;
  undefined4 local_314;
  int local_310;
  int local_30c;
  undefined8 *local_308;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  undefined8 *local_2e8;
  undefined4 local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  long local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  undefined8 *local_2b0;
  undefined4 local_2a4;
  int local_2a0;
  int local_29c;
  undefined8 *local_298;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined8 *local_278;
  undefined4 local_26c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  long *local_258;
  undefined4 local_24c;
  long local_248;
  undefined8 *local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  long *local_220;
  undefined4 local_214;
  long local_210;
  undefined1 (*local_208) [16];
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  long *local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 *local_1d0;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  undefined1 (*local_198) [16];
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long *local_178;
  undefined4 local_16c;
  long local_168;
  float *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long *local_140;
  undefined4 local_134;
  long local_130;
  float *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  long *local_108;
  undefined4 local_fc;
  long local_f8;
  float *local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1434 = *(int *)((long)in_RDI + 0x2c);
  local_1438 = (int)in_RDI[6];
  local_143c = (int)in_RDI[7];
  local_1440 = (int)in_RSI[7];
  local_1448 = *in_RCX;
  local_1408 = &local_1490;
  local_1490 = (void *)0x0;
  local_1488 = (int *)0x0;
  local_1480 = 0;
  local_1478 = 0;
  local_1470 = (long *)0x0;
  local_1468 = 0;
  local_1464 = 0;
  local_1460 = 0;
  local_145c = 0;
  local_1458 = 0;
  local_1450 = 0;
  iVar20 = (int)((ulong)in_stack_ffffffffffffe120 >> 0x20);
  local_1420 = in_RDX;
  local_1418 = in_RSI;
  local_1410 = in_RDI;
  if (local_1434 < 8) {
    if (local_1434 < 4) {
      Mat::create(in_stack_ffffffffffffe140,in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138,
                  in_stack_ffffffffffffe134,
                  CONCAT44(in_stack_ffffffffffffe12c,in_stack_ffffffffffffe128),iVar20,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffe1a4,in_stack_ffffffffffffe1a0));
    }
    else {
      Mat::create(in_stack_ffffffffffffe140,in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138,
                  in_stack_ffffffffffffe134,
                  CONCAT44(in_stack_ffffffffffffe12c,in_stack_ffffffffffffe128),iVar20,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffe1a4,in_stack_ffffffffffffe1a0));
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffe140,in_stack_ffffffffffffe13c,in_stack_ffffffffffffe138,
                in_stack_ffffffffffffe134,
                CONCAT44(in_stack_ffffffffffffe12c,in_stack_ffffffffffffe128),iVar20,
                (Allocator *)CONCAT44(in_stack_ffffffffffffe1a4,in_stack_ffffffffffffe1a0));
  }
  iVar20 = local_1434 >> 3;
  for (local_14a8 = 0; local_14a8 < iVar20; local_14a8 = local_14a8 + 1) {
    local_14ac = local_14a8 * 8;
    local_103c = local_14ac / 8;
    local_1030 = &local_1500;
    local_1038 = &local_1490;
    local_240 = (undefined8 *)((long)local_1490 + local_1450 * local_103c * local_1480);
    local_228 = &local_1500;
    local_68 = (long)local_1464 * (long)local_1460 * local_1480;
    local_ff8 = &local_1500;
    local_1400 = &local_1500;
    local_14e0 = local_1470;
    local_6c = 0x10;
    local_22c = local_1464;
    local_230 = local_1460;
    local_234 = local_145c;
    local_248 = local_1480;
    local_24c = local_1478;
    local_258 = local_1470;
    local_103d = 1;
    local_1500 = 0;
    local_14f0 = 0;
    local_14e8 = 0;
    local_14d8 = 0;
    local_14d4 = 0;
    local_14d0 = 0;
    local_14cc = 0;
    local_14c8 = 0;
    local_14c0 = 0;
    local_14f8 = 0;
    local_14b8 = local_240;
    for (local_1504 = 0; local_1504 < local_143c; local_1504 = local_1504 + 1) {
      local_eb8 = &local_1558;
      local_37c = *(int *)((long)local_1410 + 0x2c);
      local_380 = (int)local_1410[6];
      local_384 = *(undefined4 *)((long)local_1410 + 0x34);
      local_390 = *local_1410 + local_1410[8] * (long)local_1504 * local_1410[2];
      local_398 = local_1410[2];
      local_39c = (undefined4)local_1410[3];
      local_3a8 = local_1410[4];
      local_378 = &local_1558;
      local_8 = (long)local_37c * (long)local_380 * local_398;
      local_fc8 = &local_1558;
      local_1510 = (undefined8 *)(local_390 + (long)local_14ac * 4);
      local_13f0 = &local_1558;
      local_c = 0x10;
      local_ec4 = local_1504;
      local_ec5 = 1;
      local_1558 = 0;
      local_1548 = 0;
      local_1540 = 0;
      local_1530 = 0;
      local_152c = 0;
      local_1528 = 0;
      local_1524 = 0;
      local_1520 = 0;
      local_1518 = 0;
      local_1550 = 0;
      for (local_155c = 0; local_155c < local_1438; local_155c = local_155c + 1) {
        local_d10 = local_1510;
        local_1578 = *local_1510;
        uStack_1570 = local_1510[1];
        local_d18 = (undefined1 (*) [16])(local_1510 + 2);
        local_1588 = *(undefined8 *)*local_d18;
        uStack_1580 = local_1510[3];
        auVar19 = *local_d18;
        local_b18 = local_14b8;
        *local_14b8 = local_1578;
        local_14b8[1] = uStack_1570;
        local_b30 = (undefined1 (*) [16])(local_14b8 + 2);
        *local_b30 = auVar19;
        local_1510 = (undefined8 *)((long)local_1510 + (long)local_1434 * 4);
        local_14b8 = local_14b8 + 4;
        local_b48 = local_1588;
        uStack_b40 = uStack_1580;
        local_b28 = local_1578;
        uStack_b20 = uStack_1570;
      }
      local_1188 = local_13f0;
      local_1538 = local_3a8;
    }
    local_1168 = local_1400;
  }
  local_14a0 = local_1434 + iVar20 * -8 >> 2;
  for (local_158c = 0; local_158c < local_14a0; local_158c = local_158c + 1) {
    local_1590 = iVar20 * 8 + local_158c * 4;
    local_106c = local_1590 / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_1590 % 8) >> 0x1f) << 0x20 |
                             (long)local_1590 % 8 & 0xffffffffU) / 4);
    local_1060 = &local_15e0;
    local_1068 = &local_1490;
    local_208 = (undefined1 (*) [16])((long)local_1490 + local_1450 * local_106c * local_1480);
    local_1f0 = &local_15e0;
    local_78 = (long)local_1464 * (long)local_1460 * local_1480;
    local_1000 = &local_15e0;
    local_13e0 = &local_15e0;
    local_15c0 = local_1470;
    local_7c = 0x10;
    local_1f4 = local_1464;
    local_1f8 = local_1460;
    local_1fc = local_145c;
    local_210 = local_1480;
    local_214 = local_1478;
    local_220 = local_1470;
    local_106d = 1;
    local_15e0 = 0;
    local_15d0 = 0;
    local_15c8 = 0;
    local_15b8 = 0;
    local_15b4 = 0;
    local_15b0 = 0;
    local_15ac = 0;
    local_15a8 = 0;
    local_15a0 = 0;
    local_15d8 = 0;
    local_1598 = local_208;
    for (local_15e4 = 0; local_15e4 < local_143c; local_15e4 = local_15e4 + 1) {
      local_ee8 = &local_1638;
      local_344 = *(int *)((long)local_1410 + 0x2c);
      local_348 = (int)local_1410[6];
      local_34c = *(undefined4 *)((long)local_1410 + 0x34);
      local_358 = *local_1410 + local_1410[8] * (long)local_15e4 * local_1410[2];
      local_360 = local_1410[2];
      local_364 = (undefined4)local_1410[3];
      local_370 = local_1410[4];
      local_340 = &local_1638;
      local_18 = (long)local_344 * (long)local_348 * local_360;
      local_fd0 = &local_1638;
      local_15f0 = (undefined1 (*) [16])(local_358 + (long)local_1590 * 4);
      local_13d0 = &local_1638;
      local_1c = 0x10;
      local_ef4 = local_15e4;
      local_ef5 = 1;
      local_1638 = 0;
      local_1628 = 0;
      local_1620 = 0;
      local_1610 = 0;
      local_160c = 0;
      local_1608 = 0;
      local_1604 = 0;
      local_1600 = 0;
      local_15f8 = 0;
      local_1630 = 0;
      for (local_163c = 0; local_163c < local_1438; local_163c = local_163c + 1) {
        local_d20 = local_15f0;
        local_1658 = *(undefined8 *)*local_15f0;
        uStack_1650 = *(undefined8 *)(*local_15f0 + 8);
        local_b50 = local_1598;
        *local_1598 = *local_15f0;
        local_15f0 = (undefined1 (*) [16])(*local_15f0 + (long)local_1434 * 4);
        local_1598 = local_1598 + 1;
        local_b68 = local_1658;
        uStack_b60 = uStack_1650;
      }
      local_11c8 = local_13d0;
      local_1618 = local_370;
    }
    local_11a8 = local_13e0;
  }
  local_14a4 = local_14a0 * 4 + iVar20 * 8;
  for (local_165c = local_14a4; local_165c < local_1434; local_165c = local_165c + 1) {
    local_109c = local_165c / 8 +
                 (int)((long)((ulong)(uint)((int)((long)local_165c % 8) >> 0x1f) << 0x20 |
                             (long)local_165c % 8 & 0xffffffffU) / 4) + local_165c % 4;
    local_1090 = &local_16b0;
    local_1098 = &local_1490;
    local_1d0 = (undefined4 *)((long)local_1490 + local_1450 * local_109c * local_1480);
    local_1b8 = &local_16b0;
    local_88 = (long)local_1464 * (long)local_1460 * local_1480;
    local_1008 = &local_16b0;
    local_13c0 = &local_16b0;
    local_1690 = local_1470;
    local_8c = 0x10;
    local_1bc = local_1464;
    local_1c0 = local_1460;
    local_1c4 = local_145c;
    local_1d8 = local_1480;
    local_1dc = local_1478;
    local_1e8 = local_1470;
    local_109d = 1;
    local_16b0 = 0;
    local_16a0 = 0;
    local_1698 = 0;
    local_1688 = 0;
    local_1684 = 0;
    local_1680 = 0;
    local_167c = 0;
    local_1678 = 0;
    local_1670 = 0;
    local_16a8 = 0;
    local_1668 = local_1d0;
    for (local_16b4 = 0; local_16b4 < local_143c; local_16b4 = local_16b4 + 1) {
      local_f18 = &local_1708;
      local_30c = *(int *)((long)local_1410 + 0x2c);
      local_310 = (int)local_1410[6];
      local_314 = *(undefined4 *)((long)local_1410 + 0x34);
      local_320 = *local_1410 + local_1410[8] * (long)local_16b4 * local_1410[2];
      local_328 = local_1410[2];
      local_32c = (undefined4)local_1410[3];
      local_338 = local_1410[4];
      local_308 = &local_1708;
      local_28 = (long)local_30c * (long)local_310 * local_328;
      local_fd8 = &local_1708;
      local_16c0 = (undefined4 *)(local_320 + (long)local_165c * 4);
      local_13b0 = &local_1708;
      local_2c = 0x10;
      local_f24 = local_16b4;
      local_f25 = 1;
      local_1708 = 0;
      local_16f8 = 0;
      local_16f0 = 0;
      local_16e0 = 0;
      local_16dc = 0;
      local_16d8 = 0;
      local_16d4 = 0;
      local_16d0 = 0;
      local_16c8 = 0;
      local_1700 = 0;
      for (local_170c = 0; local_170c < local_1438; local_170c = local_170c + 1) {
        *local_1668 = *local_16c0;
        local_16c0 = local_16c0 + local_1434;
        local_1668 = local_1668 + 1;
      }
      local_1208 = local_13b0;
      local_16e8 = local_338;
    }
    local_11e8 = local_13c0;
  }
  for (local_1710 = 0; local_1710 < local_1440; local_1710 = local_1710 + 1) {
    local_10c0 = &local_1760;
    local_184 = *(int *)((long)local_1418 + 0x2c);
    local_188 = (int)local_1418[6];
    local_18c = *(undefined4 *)((long)local_1418 + 0x34);
    local_1718 = (undefined1 (*) [16])
                 (*local_1418 + local_1418[8] * (long)local_1710 * local_1418[2]);
    local_1a0 = local_1418[2];
    local_1a4 = (undefined4)local_1418[3];
    local_1b0 = local_1418[4];
    local_180 = &local_1760;
    local_98 = (long)local_184 * (long)local_188 * local_1a0;
    local_1010 = &local_1760;
    local_13a0 = &local_1760;
    local_9c = 0x10;
    local_10cc = local_1710;
    local_10cd = 1;
    local_1760 = 0;
    local_1750 = 0;
    local_1748 = 0;
    local_1738 = 0;
    local_1734 = 0;
    local_1730 = 0;
    local_172c = 0;
    local_1728 = 0;
    local_1720 = 0;
    local_1758 = 0;
    local_1228 = local_13a0;
    local_198 = local_1718;
    local_1740 = local_1b0;
    memset(local_1778,0,0x10);
    if (local_1448 == 0) {
      local_1cf0 = local_1778;
    }
    else {
      local_1cf0 = (undefined8 *)(local_1448 + (long)(local_1710 << 2) * 4);
    }
    local_1780 = local_1cf0;
    for (local_1784 = 0; local_1784 + 7 < local_1434; local_1784 = local_1784 + 8) {
      local_10fc = local_1784 / 8;
      local_10f0 = &local_17d8;
      local_10f8 = &local_1490;
      local_160 = (float *)((long)local_1490 + local_1450 * local_10fc * local_1480);
      local_148 = &local_17d8;
      local_a8 = (long)local_1464 * (long)local_1460 * local_1480;
      local_e88 = &local_17d8;
      local_1390 = &local_17d8;
      local_17b8 = local_1470;
      local_ac = 0x10;
      local_14c = local_1464;
      local_150 = local_1460;
      local_154 = local_145c;
      local_168 = local_1480;
      local_16c = local_1478;
      local_178 = local_1470;
      local_10fd = 1;
      local_17d8 = 0;
      local_17c8 = 0;
      local_17c0 = 0;
      local_17ac = 0;
      local_17a8 = 0;
      local_17a4 = 0;
      local_17a0 = 0;
      local_17d0 = 0;
      local_f48 = &local_1828;
      local_2d4 = *(int *)((long)local_1420 + 0x2c);
      local_2d8 = (int)local_1420[6];
      local_2dc = *(undefined4 *)((long)local_1420 + 0x34);
      local_2e8 = (undefined8 *)(*local_1420 + local_1420[8] * (long)local_1710 * local_1420[2]);
      local_2f0 = local_1420[2];
      local_2f4 = (undefined4)local_1420[3];
      local_300 = local_1420[4];
      local_2d0 = &local_1828;
      local_38 = (long)local_2d4 * (long)local_2d8 * local_2f0;
      local_3c = 0x10;
      local_f54 = local_1710;
      local_f55 = 1;
      local_1798 = 0;
      local_17b0 = 0;
      local_fe0 = &local_1828;
      local_1380 = &local_1828;
      local_1828 = 0;
      local_1818 = 0;
      local_1810 = 0;
      local_1800 = 0;
      local_17fc = 0;
      local_17f8 = 0;
      local_17f4 = 0;
      local_17f0 = 0;
      local_17e8 = 0;
      local_1820 = 0;
      local_182c = local_143c * local_1438;
      local_d28 = local_1cf0;
      local_18b8 = *local_1cf0;
      uStack_18b0 = local_1cf0[1];
      local_18a8 = local_18b8;
      uStack_18a0 = uStack_18b0;
      local_1898 = local_18b8;
      uStack_1890 = uStack_18b0;
      local_1888 = local_18b8;
      uStack_1880 = uStack_18b0;
      local_1878 = local_18b8;
      uStack_1870 = uStack_18b0;
      local_1868 = local_18b8;
      uStack_1860 = uStack_18b0;
      local_1858 = local_18b8;
      uStack_1850 = uStack_18b0;
      local_1848 = local_18b8;
      uStack_1840 = uStack_18b0;
      local_17e0 = local_2e8;
      local_1790 = local_160;
      for (local_18bc = 0; local_18bc < local_182c; local_18bc = local_18bc + 1) {
        local_b00 = local_17e0;
        local_18d8 = *local_17e0;
        uStack_18d0 = local_17e0[1];
        local_960 = local_1790;
        local_978 = *local_1790;
        local_18e8 = CONCAT44(local_978,local_978);
        uStack_18e0 = CONCAT44(local_978,local_978);
        local_980 = local_1790 + 1;
        local_998 = *local_980;
        local_18f8 = CONCAT44(local_998,local_998);
        uStack_18f0 = CONCAT44(local_998,local_998);
        local_9a0 = local_1790 + 2;
        local_9b8 = *local_9a0;
        local_1908 = CONCAT44(local_9b8,local_9b8);
        uStack_1900 = CONCAT44(local_9b8,local_9b8);
        local_9c0 = local_1790 + 3;
        local_9d8 = *local_9c0;
        local_1918 = CONCAT44(local_9d8,local_9d8);
        uStack_1910 = CONCAT44(local_9d8,local_9d8);
        local_9e0 = local_1790 + 4;
        local_9f8 = *local_9e0;
        local_1928 = CONCAT44(local_9f8,local_9f8);
        uStack_1920 = CONCAT44(local_9f8,local_9f8);
        local_a00 = local_1790 + 5;
        local_a18 = *local_a00;
        local_1938 = CONCAT44(local_a18,local_a18);
        uStack_1930 = CONCAT44(local_a18,local_a18);
        local_a20 = local_1790 + 6;
        local_a38 = *local_a20;
        local_1948 = CONCAT44(local_a38,local_a38);
        uStack_1940 = CONCAT44(local_a38,local_a38);
        local_a40 = local_1790 + 7;
        local_a58 = *local_a40;
        local_1958 = CONCAT44(local_a58,local_a58);
        uStack_1950 = CONCAT44(local_a58,local_a58);
        local_598 = local_1848;
        uStack_590 = uStack_1840;
        local_548._0_4_ = (float)local_18d8;
        local_548._4_4_ = (float)((ulong)local_18d8 >> 0x20);
        uStack_540._0_4_ = (float)uStack_18d0;
        uStack_540._4_4_ = (float)((ulong)uStack_18d0 >> 0x20);
        local_558 = local_978 * (float)local_548;
        fStack_554 = local_978 * local_548._4_4_;
        fStack_550 = local_978 * (float)uStack_540;
        fStack_54c = local_978 * uStack_540._4_4_;
        uVar1 = local_1848;
        uVar2 = uStack_1840;
        local_568._0_4_ = (float)local_1848;
        local_568._4_4_ = (float)((ulong)local_1848 >> 0x20);
        uStack_560._0_4_ = (float)uStack_1840;
        uStack_560._4_4_ = (float)((ulong)uStack_1840 >> 0x20);
        local_1848 = CONCAT44(fStack_554 + local_568._4_4_,local_558 + (float)local_568);
        uStack_1840 = CONCAT44(fStack_54c + uStack_560._4_4_,fStack_550 + (float)uStack_560);
        local_5e8 = local_1858;
        uStack_5e0 = uStack_1850;
        local_5a8 = local_998 * (float)local_548;
        fStack_5a4 = local_998 * local_548._4_4_;
        fStack_5a0 = local_998 * (float)uStack_540;
        fStack_59c = local_998 * uStack_540._4_4_;
        uVar3 = local_1858;
        uVar4 = uStack_1850;
        local_5b8._0_4_ = (float)local_1858;
        local_5b8._4_4_ = (float)((ulong)local_1858 >> 0x20);
        uStack_5b0._0_4_ = (float)uStack_1850;
        uStack_5b0._4_4_ = (float)((ulong)uStack_1850 >> 0x20);
        local_1858 = CONCAT44(fStack_5a4 + local_5b8._4_4_,local_5a8 + (float)local_5b8);
        uStack_1850 = CONCAT44(fStack_59c + uStack_5b0._4_4_,fStack_5a0 + (float)uStack_5b0);
        local_638 = local_1868;
        uStack_630 = uStack_1860;
        local_5f8 = local_9b8 * (float)local_548;
        fStack_5f4 = local_9b8 * local_548._4_4_;
        fStack_5f0 = local_9b8 * (float)uStack_540;
        fStack_5ec = local_9b8 * uStack_540._4_4_;
        uVar5 = local_1868;
        uVar6 = uStack_1860;
        local_608._0_4_ = (float)local_1868;
        local_608._4_4_ = (float)((ulong)local_1868 >> 0x20);
        uStack_600._0_4_ = (float)uStack_1860;
        uStack_600._4_4_ = (float)((ulong)uStack_1860 >> 0x20);
        local_1868 = CONCAT44(fStack_5f4 + local_608._4_4_,local_5f8 + (float)local_608);
        uStack_1860 = CONCAT44(fStack_5ec + uStack_600._4_4_,fStack_5f0 + (float)uStack_600);
        local_688 = local_1878;
        uStack_680 = uStack_1870;
        local_648 = local_9d8 * (float)local_548;
        fStack_644 = local_9d8 * local_548._4_4_;
        fStack_640 = local_9d8 * (float)uStack_540;
        fStack_63c = local_9d8 * uStack_540._4_4_;
        uVar7 = local_1878;
        uVar8 = uStack_1870;
        local_658._0_4_ = (float)local_1878;
        local_658._4_4_ = (float)((ulong)local_1878 >> 0x20);
        uStack_650._0_4_ = (float)uStack_1870;
        uStack_650._4_4_ = (float)((ulong)uStack_1870 >> 0x20);
        local_1878 = CONCAT44(fStack_644 + local_658._4_4_,local_648 + (float)local_658);
        uStack_1870 = CONCAT44(fStack_63c + uStack_650._4_4_,fStack_640 + (float)uStack_650);
        local_6d8 = local_1888;
        uStack_6d0 = uStack_1880;
        local_698 = local_9f8 * (float)local_548;
        fStack_694 = local_9f8 * local_548._4_4_;
        fStack_690 = local_9f8 * (float)uStack_540;
        fStack_68c = local_9f8 * uStack_540._4_4_;
        uVar9 = local_1888;
        uVar10 = uStack_1880;
        local_6a8._0_4_ = (float)local_1888;
        local_6a8._4_4_ = (float)((ulong)local_1888 >> 0x20);
        uStack_6a0._0_4_ = (float)uStack_1880;
        uStack_6a0._4_4_ = (float)((ulong)uStack_1880 >> 0x20);
        local_1888 = CONCAT44(fStack_694 + local_6a8._4_4_,local_698 + (float)local_6a8);
        uStack_1880 = CONCAT44(fStack_68c + uStack_6a0._4_4_,fStack_690 + (float)uStack_6a0);
        local_728 = local_1898;
        uStack_720 = uStack_1890;
        local_6e8 = local_a18 * (float)local_548;
        fStack_6e4 = local_a18 * local_548._4_4_;
        fStack_6e0 = local_a18 * (float)uStack_540;
        fStack_6dc = local_a18 * uStack_540._4_4_;
        uVar11 = local_1898;
        uVar12 = uStack_1890;
        local_6f8._0_4_ = (float)local_1898;
        local_6f8._4_4_ = (float)((ulong)local_1898 >> 0x20);
        uStack_6f0._0_4_ = (float)uStack_1890;
        uStack_6f0._4_4_ = (float)((ulong)uStack_1890 >> 0x20);
        local_1898 = CONCAT44(fStack_6e4 + local_6f8._4_4_,local_6e8 + (float)local_6f8);
        uStack_1890 = CONCAT44(fStack_6dc + uStack_6f0._4_4_,fStack_6e0 + (float)uStack_6f0);
        local_778 = local_18a8;
        uStack_770 = uStack_18a0;
        local_738 = local_a38 * (float)local_548;
        fStack_734 = local_a38 * local_548._4_4_;
        fStack_730 = local_a38 * (float)uStack_540;
        fStack_72c = local_a38 * uStack_540._4_4_;
        uVar13 = local_18a8;
        uVar14 = uStack_18a0;
        local_748._0_4_ = (float)local_18a8;
        local_748._4_4_ = (float)((ulong)local_18a8 >> 0x20);
        uStack_740._0_4_ = (float)uStack_18a0;
        uStack_740._4_4_ = (float)((ulong)uStack_18a0 >> 0x20);
        local_18a8 = CONCAT44(fStack_734 + local_748._4_4_,local_738 + (float)local_748);
        uStack_18a0 = CONCAT44(fStack_72c + uStack_740._4_4_,fStack_730 + (float)uStack_740);
        local_7c8 = local_18b8;
        uStack_7c0 = uStack_18b0;
        local_788._0_4_ = local_a58 * (float)local_548;
        local_788._4_4_ = local_a58 * local_548._4_4_;
        local_788._8_4_ = local_a58 * (float)uStack_540;
        local_788._12_4_ = local_a58 * uStack_540._4_4_;
        uVar15 = local_18b8;
        uVar16 = uStack_18b0;
        local_798._0_4_ = (float)local_18b8;
        local_798._4_4_ = (float)((ulong)local_18b8 >> 0x20);
        uStack_790._0_4_ = (float)uStack_18b0;
        uStack_790._4_4_ = (float)((ulong)uStack_18b0 >> 0x20);
        local_18b8 = CONCAT44(local_788._4_4_ + local_798._4_4_,local_788._0_4_ + (float)local_798);
        uStack_18b0 = CONCAT44(local_788._12_4_ + uStack_790._4_4_,
                               local_788._8_4_ + (float)uStack_790);
        local_1790 = local_1790 + 8;
        local_17e0 = local_17e0 + 2;
        fStack_a54 = local_a58;
        fStack_a50 = local_a58;
        fStack_a4c = local_a58;
        local_a44 = local_a58;
        fStack_a34 = local_a38;
        fStack_a30 = local_a38;
        fStack_a2c = local_a38;
        local_a24 = local_a38;
        fStack_a14 = local_a18;
        fStack_a10 = local_a18;
        fStack_a0c = local_a18;
        local_a04 = local_a18;
        fStack_9f4 = local_9f8;
        fStack_9f0 = local_9f8;
        fStack_9ec = local_9f8;
        local_9e4 = local_9f8;
        fStack_9d4 = local_9d8;
        fStack_9d0 = local_9d8;
        fStack_9cc = local_9d8;
        local_9c4 = local_9d8;
        fStack_9b4 = local_9b8;
        fStack_9b0 = local_9b8;
        fStack_9ac = local_9b8;
        local_9a4 = local_9b8;
        fStack_994 = local_998;
        fStack_990 = local_998;
        fStack_98c = local_998;
        local_984 = local_998;
        fStack_974 = local_978;
        fStack_970 = local_978;
        fStack_96c = local_978;
        local_964 = local_978;
        local_7b8 = local_18d8;
        uStack_7b0 = uStack_18d0;
        local_7a8 = local_1958;
        uStack_7a0 = uStack_1950;
        local_798 = uVar15;
        uStack_790 = uVar16;
        local_768 = local_18d8;
        uStack_760 = uStack_18d0;
        local_758 = local_1948;
        uStack_750 = uStack_1940;
        local_748 = uVar13;
        uStack_740 = uVar14;
        local_718 = local_18d8;
        uStack_710 = uStack_18d0;
        local_708 = local_1938;
        uStack_700 = uStack_1930;
        local_6f8 = uVar11;
        uStack_6f0 = uVar12;
        local_6c8 = local_18d8;
        uStack_6c0 = uStack_18d0;
        local_6b8 = local_1928;
        uStack_6b0 = uStack_1920;
        local_6a8 = uVar9;
        uStack_6a0 = uVar10;
        local_678 = local_18d8;
        uStack_670 = uStack_18d0;
        local_668 = local_1918;
        uStack_660 = uStack_1910;
        local_658 = uVar7;
        uStack_650 = uVar8;
        local_628 = local_18d8;
        uStack_620 = uStack_18d0;
        local_618 = local_1908;
        uStack_610 = uStack_1900;
        local_608 = uVar5;
        uStack_600 = uVar6;
        local_5d8 = local_18d8;
        uStack_5d0 = uStack_18d0;
        local_5c8 = local_18f8;
        uStack_5c0 = uStack_18f0;
        local_5b8 = uVar3;
        uStack_5b0 = uVar4;
        local_588 = local_18d8;
        uStack_580 = uStack_18d0;
        local_578 = local_18e8;
        uStack_570 = uStack_18e0;
        local_568 = uVar1;
        uStack_560 = uVar2;
        local_548 = local_18d8;
        uStack_540 = uStack_18d0;
        local_538 = local_18e8;
        uStack_530 = uStack_18e0;
        local_528 = local_18d8;
        uStack_520 = uStack_18d0;
        local_518 = local_18f8;
        uStack_510 = uStack_18f0;
        local_508 = local_18d8;
        uStack_500 = uStack_18d0;
        local_4f8 = local_1908;
        uStack_4f0 = uStack_1900;
        local_4e8 = local_18d8;
        uStack_4e0 = uStack_18d0;
        local_4d8 = local_1918;
        uStack_4d0 = uStack_1910;
        local_4c8 = local_18d8;
        uStack_4c0 = uStack_18d0;
        local_4b8 = local_1928;
        uStack_4b0 = uStack_1920;
        local_4a8 = local_18d8;
        uStack_4a0 = uStack_18d0;
        local_498 = local_1938;
        uStack_490 = uStack_1930;
        local_488 = local_18d8;
        uStack_480 = uStack_18d0;
        local_478 = local_1948;
        uStack_470 = uStack_1940;
        local_468 = local_18d8;
        uStack_460 = uStack_18d0;
        local_458 = local_1958;
        uStack_450 = uStack_1950;
      }
      local_b70 = local_1718;
      local_b88 = local_1848;
      uStack_b80 = uStack_1840;
      *(undefined8 *)*local_1718 = local_1848;
      *(undefined8 *)(*local_1718 + 8) = uStack_1840;
      local_b90 = local_1718 + 1;
      local_ba8 = local_1858;
      uStack_ba0 = uStack_1850;
      *(undefined8 *)*local_b90 = local_1858;
      *(undefined8 *)(local_1718[1] + 8) = uStack_1850;
      local_bb0 = local_1718 + 2;
      local_bc8 = local_1868;
      uStack_bc0 = uStack_1860;
      *(undefined8 *)*local_bb0 = local_1868;
      *(undefined8 *)(local_1718[2] + 8) = uStack_1860;
      local_bd0 = local_1718 + 3;
      local_be8 = local_1878;
      uStack_be0 = uStack_1870;
      *(undefined8 *)*local_bd0 = local_1878;
      *(undefined8 *)(local_1718[3] + 8) = uStack_1870;
      local_bf0 = local_1718 + 4;
      local_c08 = local_1888;
      uStack_c00 = uStack_1880;
      *(undefined8 *)*local_bf0 = local_1888;
      *(undefined8 *)(local_1718[4] + 8) = uStack_1880;
      local_c10 = local_1718 + 5;
      local_c28 = local_1898;
      uStack_c20 = uStack_1890;
      *(undefined8 *)*local_c10 = local_1898;
      *(undefined8 *)(local_1718[5] + 8) = uStack_1890;
      local_c30 = local_1718 + 6;
      local_c48 = local_18a8;
      uStack_c40 = uStack_18a0;
      *(undefined8 *)*local_c30 = local_18a8;
      *(undefined8 *)(local_1718[6] + 8) = uStack_18a0;
      local_c50 = local_1718 + 7;
      local_c68 = local_18b8;
      uStack_c60 = uStack_18b0;
      auVar19._8_8_ = uStack_18b0;
      auVar19._0_8_ = local_18b8;
      *local_c50 = auVar19;
      local_1718 = local_1718 + 8;
      local_1268 = local_1380;
      local_1248 = local_1390;
      local_1808 = local_300;
    }
    for (; local_1784 + 3 < local_1434; local_1784 = local_1784 + 4) {
      local_112c = local_1784 / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_1784 % 8) >> 0x1f) << 0x20 |
                               (long)local_1784 % 8 & 0xffffffffU) / 4);
      local_1120 = &local_19a8;
      local_1128 = &local_1490;
      local_128 = (float *)((long)local_1490 + local_1450 * local_112c * local_1480);
      local_110 = &local_19a8;
      local_b8 = (long)local_1464 * (long)local_1460 * local_1480;
      local_e90 = &local_19a8;
      local_1370 = &local_19a8;
      local_1988 = local_1470;
      local_bc = 0x10;
      local_114 = local_1464;
      local_118 = local_1460;
      local_11c = local_145c;
      local_130 = local_1480;
      local_134 = local_1478;
      local_140 = local_1470;
      local_112d = 1;
      local_19a8 = 0;
      local_1998 = 0;
      local_1990 = 0;
      local_197c = 0;
      local_1978 = 0;
      local_1974 = 0;
      local_1970 = 0;
      local_19a0 = 0;
      local_f78 = &local_19f8;
      local_29c = *(int *)((long)local_1420 + 0x2c);
      local_2a0 = (int)local_1420[6];
      local_2a4 = *(undefined4 *)((long)local_1420 + 0x34);
      local_2b0 = (undefined8 *)(*local_1420 + local_1420[8] * (long)local_1710 * local_1420[2]);
      local_2b8 = local_1420[2];
      local_2bc = (undefined4)local_1420[3];
      local_2c8 = local_1420[4];
      local_298 = &local_19f8;
      local_48 = (long)local_29c * (long)local_2a0 * local_2b8;
      local_4c = 0x10;
      local_f84 = local_1710;
      local_f85 = 1;
      local_1968 = 0;
      local_1980 = 0;
      local_fe8 = &local_19f8;
      local_1360 = &local_19f8;
      local_19f8 = 0;
      local_19e8 = 0;
      local_19e0 = 0;
      local_19d0 = 0;
      local_19cc = 0;
      local_19c8 = 0;
      local_19c4 = 0;
      local_19c0 = 0;
      local_19b8 = 0;
      local_19f0 = 0;
      local_19fc = local_143c * local_1438;
      local_d30 = local_1cf0;
      local_1a48 = *local_1cf0;
      uStack_1a40 = local_1cf0[1];
      local_1a38 = local_1a48;
      uStack_1a30 = uStack_1a40;
      local_1a28 = local_1a48;
      uStack_1a20 = uStack_1a40;
      local_1a18 = local_1a48;
      uStack_1a10 = uStack_1a40;
      local_19b0 = local_2b0;
      local_1960 = local_128;
      for (local_1a4c = 0; local_1a4c < local_19fc; local_1a4c = local_1a4c + 1) {
        local_b08 = local_19b0;
        local_1a68 = *local_19b0;
        uStack_1a60 = local_19b0[1];
        local_a60 = local_1960;
        local_a78 = *local_1960;
        local_1a78 = CONCAT44(local_a78,local_a78);
        uStack_1a70 = CONCAT44(local_a78,local_a78);
        local_a80 = local_1960 + 1;
        local_a98 = *local_a80;
        local_1a88 = CONCAT44(local_a98,local_a98);
        uStack_1a80 = CONCAT44(local_a98,local_a98);
        local_aa0 = local_1960 + 2;
        local_ab8 = *local_aa0;
        local_1a98 = CONCAT44(local_ab8,local_ab8);
        uStack_1a90 = CONCAT44(local_ab8,local_ab8);
        local_ac0 = local_1960 + 3;
        local_ad8 = *local_ac0;
        local_1aa8 = CONCAT44(local_ad8,local_ad8);
        uStack_1aa0 = CONCAT44(local_ad8,local_ad8);
        local_818 = local_1a18;
        uStack_810 = uStack_1a10;
        local_448._0_4_ = (float)local_1a68;
        local_448._4_4_ = (float)((ulong)local_1a68 >> 0x20);
        uStack_440._0_4_ = (float)uStack_1a60;
        uStack_440._4_4_ = (float)((ulong)uStack_1a60 >> 0x20);
        local_7d8 = local_a78 * (float)local_448;
        fStack_7d4 = local_a78 * local_448._4_4_;
        fStack_7d0 = local_a78 * (float)uStack_440;
        fStack_7cc = local_a78 * uStack_440._4_4_;
        uVar1 = local_1a18;
        uVar2 = uStack_1a10;
        local_7e8._0_4_ = (float)local_1a18;
        local_7e8._4_4_ = (float)((ulong)local_1a18 >> 0x20);
        uStack_7e0._0_4_ = (float)uStack_1a10;
        uStack_7e0._4_4_ = (float)((ulong)uStack_1a10 >> 0x20);
        local_1a18 = CONCAT44(fStack_7d4 + local_7e8._4_4_,local_7d8 + (float)local_7e8);
        uStack_1a10 = CONCAT44(fStack_7cc + uStack_7e0._4_4_,fStack_7d0 + (float)uStack_7e0);
        local_868 = local_1a28;
        uStack_860 = uStack_1a20;
        local_828 = local_a98 * (float)local_448;
        fStack_824 = local_a98 * local_448._4_4_;
        fStack_820 = local_a98 * (float)uStack_440;
        fStack_81c = local_a98 * uStack_440._4_4_;
        uVar3 = local_1a28;
        uVar4 = uStack_1a20;
        local_838._0_4_ = (float)local_1a28;
        local_838._4_4_ = (float)((ulong)local_1a28 >> 0x20);
        uStack_830._0_4_ = (float)uStack_1a20;
        uStack_830._4_4_ = (float)((ulong)uStack_1a20 >> 0x20);
        local_1a28 = CONCAT44(fStack_824 + local_838._4_4_,local_828 + (float)local_838);
        uStack_1a20 = CONCAT44(fStack_81c + uStack_830._4_4_,fStack_820 + (float)uStack_830);
        local_8b8 = local_1a38;
        uStack_8b0 = uStack_1a30;
        local_878 = local_ab8 * (float)local_448;
        fStack_874 = local_ab8 * local_448._4_4_;
        fStack_870 = local_ab8 * (float)uStack_440;
        fStack_86c = local_ab8 * uStack_440._4_4_;
        uVar5 = local_1a38;
        uVar6 = uStack_1a30;
        local_888._0_4_ = (float)local_1a38;
        local_888._4_4_ = (float)((ulong)local_1a38 >> 0x20);
        uStack_880._0_4_ = (float)uStack_1a30;
        uStack_880._4_4_ = (float)((ulong)uStack_1a30 >> 0x20);
        local_1a38 = CONCAT44(fStack_874 + local_888._4_4_,local_878 + (float)local_888);
        uStack_1a30 = CONCAT44(fStack_86c + uStack_880._4_4_,fStack_870 + (float)uStack_880);
        local_908 = local_1a48;
        uStack_900 = uStack_1a40;
        local_8c8._0_4_ = local_ad8 * (float)local_448;
        local_8c8._4_4_ = local_ad8 * local_448._4_4_;
        local_8c8._8_4_ = local_ad8 * (float)uStack_440;
        local_8c8._12_4_ = local_ad8 * uStack_440._4_4_;
        uVar7 = local_1a48;
        uVar8 = uStack_1a40;
        local_8d8._0_4_ = (float)local_1a48;
        local_8d8._4_4_ = (float)((ulong)local_1a48 >> 0x20);
        uStack_8d0._0_4_ = (float)uStack_1a40;
        uStack_8d0._4_4_ = (float)((ulong)uStack_1a40 >> 0x20);
        local_1a48 = CONCAT44(local_8c8._4_4_ + local_8d8._4_4_,local_8c8._0_4_ + (float)local_8d8);
        uStack_1a40 = CONCAT44(local_8c8._12_4_ + uStack_8d0._4_4_,
                               local_8c8._8_4_ + (float)uStack_8d0);
        local_1960 = local_1960 + 4;
        local_19b0 = local_19b0 + 2;
        fStack_ad4 = local_ad8;
        fStack_ad0 = local_ad8;
        fStack_acc = local_ad8;
        local_ac4 = local_ad8;
        fStack_ab4 = local_ab8;
        fStack_ab0 = local_ab8;
        fStack_aac = local_ab8;
        local_aa4 = local_ab8;
        fStack_a94 = local_a98;
        fStack_a90 = local_a98;
        fStack_a8c = local_a98;
        local_a84 = local_a98;
        fStack_a74 = local_a78;
        fStack_a70 = local_a78;
        fStack_a6c = local_a78;
        local_a64 = local_a78;
        local_8f8 = local_1a68;
        uStack_8f0 = uStack_1a60;
        local_8e8 = local_1aa8;
        uStack_8e0 = uStack_1aa0;
        local_8d8 = uVar7;
        uStack_8d0 = uVar8;
        local_8a8 = local_1a68;
        uStack_8a0 = uStack_1a60;
        local_898 = local_1a98;
        uStack_890 = uStack_1a90;
        local_888 = uVar5;
        uStack_880 = uVar6;
        local_858 = local_1a68;
        uStack_850 = uStack_1a60;
        local_848 = local_1a88;
        uStack_840 = uStack_1a80;
        local_838 = uVar3;
        uStack_830 = uVar4;
        local_808 = local_1a68;
        uStack_800 = uStack_1a60;
        local_7f8 = local_1a78;
        uStack_7f0 = uStack_1a70;
        local_7e8 = uVar1;
        uStack_7e0 = uVar2;
        local_448 = local_1a68;
        uStack_440 = uStack_1a60;
        local_438 = local_1a78;
        uStack_430 = uStack_1a70;
        local_428 = local_1a68;
        uStack_420 = uStack_1a60;
        local_418 = local_1a88;
        uStack_410 = uStack_1a80;
        local_408 = local_1a68;
        uStack_400 = uStack_1a60;
        local_3f8 = local_1a98;
        uStack_3f0 = uStack_1a90;
        local_3e8 = local_1a68;
        uStack_3e0 = uStack_1a60;
        local_3d8 = local_1aa8;
        uStack_3d0 = uStack_1aa0;
      }
      local_c70 = local_1718;
      local_c88 = local_1a18;
      uStack_c80 = uStack_1a10;
      *(undefined8 *)*local_1718 = local_1a18;
      *(undefined8 *)(*local_1718 + 8) = uStack_1a10;
      local_c90 = local_1718 + 1;
      local_ca8 = local_1a28;
      uStack_ca0 = uStack_1a20;
      *(undefined8 *)*local_c90 = local_1a28;
      *(undefined8 *)(local_1718[1] + 8) = uStack_1a20;
      local_cb0 = local_1718 + 2;
      local_cc8 = local_1a38;
      uStack_cc0 = uStack_1a30;
      *(undefined8 *)*local_cb0 = local_1a38;
      *(undefined8 *)(local_1718[2] + 8) = uStack_1a30;
      local_cd0 = local_1718 + 3;
      local_ce8 = local_1a48;
      uStack_ce0 = uStack_1a40;
      auVar18._8_8_ = uStack_1a40;
      auVar18._0_8_ = local_1a48;
      *local_cd0 = auVar18;
      local_1718 = local_1718 + 4;
      local_12a8 = local_1360;
      local_1288 = local_1370;
      local_19d8 = local_2c8;
    }
    for (; local_1784 < local_1434; local_1784 = local_1784 + 1) {
      local_115c = local_1784 / 8 +
                   (int)((long)((ulong)(uint)((int)((long)local_1784 % 8) >> 0x1f) << 0x20 |
                               (long)local_1784 % 8 & 0xffffffffU) / 4) + local_1784 % 4;
      local_1150 = &local_1af8;
      local_1158 = &local_1490;
      local_f0 = (float *)((long)local_1490 + local_1450 * local_115c * local_1480);
      local_d8 = &local_1af8;
      local_c8 = (long)local_1464 * (long)local_1460 * local_1480;
      local_e98 = &local_1af8;
      local_1350 = &local_1af8;
      local_fa8 = &local_1b48;
      local_264 = *(int *)((long)local_1420 + 0x2c);
      local_268 = (int)local_1420[6];
      local_26c = *(undefined4 *)((long)local_1420 + 0x34);
      local_278 = (undefined8 *)(*local_1420 + local_1420[8] * (long)local_1710 * local_1420[2]);
      local_280 = local_1420[2];
      local_284 = (undefined4)local_1420[3];
      local_290 = local_1420[4];
      local_260 = &local_1b48;
      local_58 = (long)local_264 * (long)local_268 * local_280;
      local_5c = 0x10;
      local_cc = 0x10;
      local_dc = local_1464;
      local_e0 = local_1460;
      local_e4 = local_145c;
      local_f8 = local_1480;
      local_fc = local_1478;
      local_108 = local_1470;
      local_ff0 = &local_1b48;
      local_1340 = &local_1b48;
      local_1ac0 = 0;
      local_1ac4 = 0;
      local_1ac8 = 0;
      local_1acc = 0;
      local_1ad8 = local_1470;
      local_1ae0 = 0;
      local_1ae8 = 0;
      local_1af0 = 0;
      local_1af8 = 0;
      local_fb4 = local_1710;
      local_fb5 = 1;
      local_115d = 1;
      local_1ab8 = 0;
      local_1ad0 = 0;
      local_1b48 = 0;
      local_1b38 = 0;
      local_1b30 = 0;
      local_1b20 = 0;
      local_1b1c = 0;
      local_1b18 = 0;
      local_1b14 = 0;
      local_1b10 = 0;
      local_1b08 = 0;
      local_1b40 = 0;
      local_d38 = local_1cf0;
      local_1b68 = *local_1cf0;
      uStack_1b60 = local_1cf0[1];
      local_1b00 = local_278;
      local_1ab0 = local_f0;
      for (local_1b6c = 0; local_1b6c < local_143c * local_1438; local_1b6c = local_1b6c + 1) {
        local_b10 = local_1b00;
        local_938 = *local_1b00;
        uStack_930 = local_1b00[1];
        local_ae0 = local_1ab0;
        local_af8 = *local_1ab0;
        local_948 = CONCAT44(local_af8,local_af8);
        uStack_940 = CONCAT44(local_af8,local_af8);
        local_958 = local_1b68;
        uStack_950 = uStack_1b60;
        local_3b8._0_4_ = (float)local_938;
        local_3b8._4_4_ = (float)((ulong)local_938 >> 0x20);
        uStack_3b0._0_4_ = (float)uStack_930;
        uStack_3b0._4_4_ = (float)((ulong)uStack_930 >> 0x20);
        local_918._0_4_ = (float)local_3b8 * local_af8;
        local_918._4_4_ = local_3b8._4_4_ * local_af8;
        local_918._8_4_ = (float)uStack_3b0 * local_af8;
        local_918._12_4_ = uStack_3b0._4_4_ * local_af8;
        uVar1 = local_1b68;
        uVar2 = uStack_1b60;
        local_928._0_4_ = (float)local_1b68;
        local_928._4_4_ = (float)((ulong)local_1b68 >> 0x20);
        uStack_920._0_4_ = (float)uStack_1b60;
        uStack_920._4_4_ = (float)((ulong)uStack_1b60 >> 0x20);
        local_1b68 = CONCAT44(local_918._4_4_ + local_928._4_4_,local_918._0_4_ + (float)local_928);
        uStack_1b60 = CONCAT44(local_918._12_4_ + uStack_920._4_4_,
                               local_918._8_4_ + (float)uStack_920);
        local_1ab0 = local_1ab0 + 1;
        local_1b00 = local_1b00 + 2;
        fStack_af4 = local_af8;
        fStack_af0 = local_af8;
        fStack_aec = local_af8;
        local_ae4 = local_af8;
        local_928 = uVar1;
        uStack_920 = uVar2;
        local_3c8 = local_948;
        uStack_3c0 = uStack_940;
        local_3b8 = local_938;
        uStack_3b0 = uStack_930;
      }
      local_cf0 = local_1718;
      local_d08 = local_1b68;
      uStack_d00 = uStack_1b60;
      auVar17._8_8_ = uStack_1b60;
      auVar17._0_8_ = local_1b68;
      *local_1718 = auVar17;
      local_1718 = local_1718 + 1;
      local_12e8 = local_1340;
      local_12c8 = local_1350;
      local_1b28 = local_290;
    }
  }
  local_1330 = &local_1490;
  if (local_1488 != (int *)0x0) {
    local_130c = 0xffffffff;
    LOCK();
    local_1310 = *local_1488;
    *local_1488 = *local_1488 + -1;
    UNLOCK();
    if (local_1310 == 1) {
      local_1308 = local_1330;
      if (local_1470 == (long *)0x0) {
        local_d48 = local_1490;
        if (local_1490 != (void *)0x0) {
          free(local_1490);
        }
      }
      else {
        (**(code **)(*local_1470 + 0x18))(local_1470,local_1490);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    __m128 _r1 = _mm_loadu_ps(img0 + 4);
                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);
            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }
}